

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  string *psVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  
  bVar7 = length == 0;
  if (!bVar7) {
    bVar5 = *first == '\n' || *first == '\r';
    psVar1 = &(this->super_LineParser).Line;
    lVar6 = 0;
    do {
      if ((first[lVar6] == '\r') || (first[lVar6] == '\n')) {
        if (!bVar5) {
          poVar4 = (this->super_LineParser).Log;
          if ((poVar4 != (ostream *)0x0) &&
             (__s = (this->super_LineParser).Prefix, __s != (char *)0x0)) {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(this->super_LineParser).Line._M_dataplus._M_p,
                                (this->super_LineParser).Line._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          }
          iVar2 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])(this);
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar1,0,(char *)(this->super_LineParser).Line._M_string_length,
                       0x674b0e);
            return bVar7;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)psVar1,0,(char *)(this->super_LineParser).Line._M_string_length,0x674b0e
                    );
          bVar5 = true;
        }
      }
      else {
        bVar5 = false;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)psVar1,(this->super_LineParser).Line._M_string_length,0,'\x01');
      }
      lVar6 = lVar6 + 1;
      bVar7 = length == lVar6;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool ProcessChunk(const char* first, int length) CM_OVERRIDE
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line = "";
            return false;
          }

          this->Line = "";
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }